

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O0

size_t __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
::cancel(deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
         *this,implementation_type *impl,error_code *ec)

{
  epoll_reactor *this_00;
  unsigned_long max_cancelled;
  error_code local_50;
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
  *local_40;
  size_t count;
  error_category *local_30;
  error_code *local_28;
  error_code *ec_local;
  implementation_type *impl_local;
  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
  *this_local;
  
  local_28 = ec;
  ec_local = (error_code *)impl;
  impl_local = (implementation_type *)this;
  if ((impl->might_have_pending_waits & 1U) == 0) {
    std::error_code::error_code((error_code *)&count);
    *(size_t *)local_28 = count;
    local_28->_M_cat = local_30;
    this_local = (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
                  *)0x0;
  }
  else {
    this_00 = this->scheduler_;
    max_cancelled = std::numeric_limits<unsigned_long>::max();
    local_40 = (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
                *)epoll_reactor::
                  cancel_timer<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,asio::wait_traits<std::chrono::_V2::system_clock>>>
                            (this_00,&this->timer_queue_,&impl->timer_data,max_cancelled);
    *(undefined1 *)&ec_local->_M_cat = 0;
    std::error_code::error_code(&local_50);
    local_28->_M_value = local_50._M_value;
    *(undefined4 *)&local_28->field_0x4 = local_50._4_4_;
    local_28->_M_cat = local_50._M_cat;
    this_local = local_40;
  }
  return (size_t)this_local;
}

Assistant:

std::size_t cancel(implementation_type& impl, asio::error_code& ec)
  {
    if (!impl.might_have_pending_waits)
    {
      ec = asio::error_code();
      return 0;
    }

    ASIO_HANDLER_OPERATION((scheduler_.context(),
          "deadline_timer", &impl, 0, "cancel"));

    std::size_t count = scheduler_.cancel_timer(timer_queue_, impl.timer_data);
    impl.might_have_pending_waits = false;
    ec = asio::error_code();
    return count;
  }